

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::AllowedDirectoriesSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  pointer pVVar1;
  vector<duckdb::Value,_true> *pvVar2;
  InvalidInputException *this;
  pointer this_00;
  string local_50;
  
  if ((config->options).enable_external_access != false) {
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(config->options).allowed_directories._M_t);
    pvVar2 = ListValue::GetChildren(input);
    this_00 = (pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar1 = (pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_00 != pVVar1) {
      do {
        Value::GetValue<std::__cxx11::string>(&local_50,this_00);
        DBConfig::AddAllowedDirectory(config,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pVVar1);
    }
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Cannot change allowed_directories when enable_external_access is disabled","");
  InvalidInputException::InvalidInputException(this,(string *)&local_50);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void AllowedDirectoriesSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	if (!config.options.enable_external_access) {
		throw InvalidInputException("Cannot change allowed_directories when enable_external_access is disabled");
	}
	config.options.allowed_directories.clear();
	auto &list = ListValue::GetChildren(input);
	for (auto &val : list) {
		config.AddAllowedDirectory(val.GetValue<string>());
	}
}